

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  string *s;
  int iVar1;
  OptionParser *this_00;
  OptionParser *this_01;
  string *this_02;
  undefined1 local_c8 [8];
  string keyword;
  undefined1 local_88 [8];
  string s2;
  string s1;
  string value;
  
  s = (tokenList->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)s)) {
    s2.field_2._8_8_ = &s1._M_string_length;
    s1._M_dataplus._M_p = (pointer)0x0;
    local_88 = (undefined1  [8])&s2._M_string_length;
    s2._M_dataplus._M_p = (pointer)0x0;
    s1._M_string_length._0_1_ = 0;
    s2._M_string_length._0_1_ = 0;
    local_c8 = (undefined1  [8])&keyword._M_string_length;
    keyword._M_dataplus._M_p = (pointer)0x0;
    keyword._M_string_length._0_1_ = 0;
    std::__cxx11::string::string
              ((string *)(s1.field_2._M_local_buf + 8),"",
               (allocator *)(keyword.field_2._M_local_buf + 8));
    Utilities::upperCase((string *)((long)&keyword.field_2 + 8),s);
    std::__cxx11::string::operator=
              ((string *)(s2.field_2._M_local_buf + 8),(string *)(keyword.field_2._M_local_buf + 8))
    ;
    std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
    std::__cxx11::string::_M_assign((string *)local_88);
    std::__cxx11::string::_M_assign((string *)(s1.field_2._M_local_buf + 8));
    iVar1 = Utilities::findFullMatch((string *)((long)&s2.field_2 + 8),deprecatedKeywords);
    if (iVar1 < 0) {
      this_00 = (OptionParser *)0x144a7a;
      this_01 = (OptionParser *)(s2.field_2._M_local_buf + 8);
      iVar1 = std::__cxx11::string::compare((char *)this_01);
      if (iVar1 == 0) {
        if ((long)(tokenList->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(tokenList->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0x40) {
          this_01 = (OptionParser *)(s1.field_2._M_local_buf + 8);
          std::__cxx11::string::assign((char *)this_01);
        }
        parseQualOption(this_01,(string *)local_88,(string *)((long)&s1.field_2 + 8),network);
      }
      else {
        getEpanet3Keyword((string *)((long)&keyword.field_2 + 8),this_00,
                          (string *)((long)&s2.field_2 + 8),(string *)local_88,
                          (string *)((long)&s1.field_2 + 8));
        this_02 = (string *)(keyword.field_2._M_local_buf + 8);
        std::__cxx11::string::operator=((string *)local_c8,this_02);
        std::__cxx11::string::~string(this_02);
        if (value._M_dataplus._M_p != (pointer)0x0) {
          setOption((OptionParser *)this_02,(string *)local_c8,(string *)((long)&s1.field_2 + 8),
                    network);
        }
      }
    }
    std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void OptionParser::parseOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens
    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];

    // ... parse option keywords
    string s1, s2, keyword;
    string value = "";
    s1 = Utilities::upperCase(tokens[0]);
    s2 = tokens[1];
    if ( tokenList.size() > 2 )
    {
        value = tokens[2];
    }
    else value = s2;

    // ... check for deprecated keywords
    if ( Utilities::findFullMatch(s1, deprecatedKeywords) >= 0 ) return;

    // ... check for EPANET2 "QUALITY" keyword which requires special processing
    if ( s1.compare(w_QUALITY) == 0 )
    {
        if ( tokenList.size() == 2 ) value = "";
        parseQualOption(s2, value, network);
        return;
    }

    // ... get the equivalent EPANET3 keyword
    keyword = getEpanet3Keyword(s1, s2, value);

    // ... set the appropriate option to the parsed value
    if ( !value.empty() ) setOption(keyword, value, network);
}